

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.cpp
# Opt level: O3

EncodeNumberStatus
spvtools::utils::ParseAndEncodeNumber
          (char *text,NumberType *type,function<void_(unsigned_int)> *emit,string *error_msg)

{
  EncodeNumberStatus EVar1;
  _Manager_type p_Var2;
  _Any_data *p_Var3;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  ErrorMsgStream local_38;
  
  p_Var3 = &local_78;
  if (text == (char *)0x0) {
    anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_38,error_msg);
    (anonymous_namespace)::ErrorMsgStream::operator<<
              ((ErrorMsgStream *)&local_38,"The given text is a nullptr");
    anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_38);
    return kInvalidText;
  }
  if (type->kind == SPV_NUMBER_FLOATING) {
    local_48 = (_Manager_type)0x0;
    p_Stack_40 = (_Invoker_type)0x0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    p_Var2 = (emit->super__Function_base)._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)(&local_58,(_Any_data *)emit,__clone_functor);
      local_48 = (emit->super__Function_base)._M_manager;
      p_Stack_40 = emit->_M_invoker;
    }
    EVar1 = ParseAndEncodeFloatingPointNumber
                      (text,type,(function<void_(unsigned_int)> *)&local_58,error_msg);
    if (local_48 == (_Manager_type)0x0) {
      return EVar1;
    }
    p_Var3 = &local_58;
    p_Var2 = local_48;
  }
  else {
    if (type->kind == SPV_NUMBER_NONE) {
      anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_38,error_msg);
      (anonymous_namespace)::ErrorMsgStream::operator<<
                ((ErrorMsgStream *)&local_38,"The expected type is not a integer or float type");
      anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_38);
      return kInvalidUsage;
    }
    local_68 = (_Manager_type)0x0;
    p_Stack_60 = (_Invoker_type)0x0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    p_Var2 = (emit->super__Function_base)._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)(&local_78,(_Any_data *)emit,__clone_functor);
      local_68 = (emit->super__Function_base)._M_manager;
      p_Stack_60 = emit->_M_invoker;
    }
    EVar1 = ParseAndEncodeIntegerNumber
                      (text,type,(function<void_(unsigned_int)> *)&local_78,error_msg);
    p_Var2 = local_68;
    if (local_68 == (_Manager_type)0x0) {
      return EVar1;
    }
  }
  (*p_Var2)(p_Var3,p_Var3,__destroy_functor);
  return EVar1;
}

Assistant:

EncodeNumberStatus ParseAndEncodeNumber(const char* text,
                                        const NumberType& type,
                                        std::function<void(uint32_t)> emit,
                                        std::string* error_msg) {
  if (!text) {
    ErrorMsgStream(error_msg) << "The given text is a nullptr";
    return EncodeNumberStatus::kInvalidText;
  }

  if (IsUnknown(type)) {
    ErrorMsgStream(error_msg)
        << "The expected type is not a integer or float type";
    return EncodeNumberStatus::kInvalidUsage;
  }

  // If we explicitly expect a floating-point number, we should handle that
  // first.
  if (IsFloating(type)) {
    return ParseAndEncodeFloatingPointNumber(text, type, emit, error_msg);
  }

  return ParseAndEncodeIntegerNumber(text, type, emit, error_msg);
}